

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O0

int ARKodeSetRelaxFn(void *arkode_mem,ARKRelaxFn rfn,ARKRelaxJacFn rjac)

{
  ARKRelaxJacFn in_RDX;
  ARKRelaxFn in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x19e,"ARKodeSetRelaxFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->tempv1->ops->nvdotprod == (_func_sunrealtype_N_Vector_N_Vector *)0x0) {
    arkProcessError(in_RDI,-0x16,0x1a7,"ARKodeSetRelaxFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,"N_VDotProd unimplemented (required for relaxation)");
    local_4 = -0x16;
  }
  else if (in_RDI->step_setrelaxfn == (ARKTimestepSetRelaxFn)0x0) {
    arkProcessError(in_RDI,-0x30,0x1b3,"ARKodeSetRelaxFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,"time-stepping module does not support relaxation");
    local_4 = -0x30;
  }
  else {
    local_4 = (*in_RDI->step_setrelaxfn)(in_RDI,in_RSI,in_RDX);
  }
  return local_4;
}

Assistant:

int ARKodeSetRelaxFn(void* arkode_mem, ARKRelaxFn rfn, ARKRelaxJacFn rjac)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Ensure that the current N_Vector supports N_VDotProd */
  if (ark_mem->tempv1->ops->nvdotprod == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "N_VDotProd unimplemented (required for relaxation)");
    return (ARK_ILL_INPUT);
  }

  /* Call stepper-specific routine (if it exists) */
  if (ark_mem->step_setrelaxfn)
  {
    return ark_mem->step_setrelaxfn(arkode_mem, rfn, rjac);
  }
  else
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }
}